

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChRotUtils.h
# Opt level: O3

void chrono::fea::rotutils::RotAndDRot
               (ChVector<double> *phi,ChMatrix33<double> *Phi,ChMatrix33<double> *Ga)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  ActualDstType actualDst;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  double coeff [3];
  double local_38;
  double local_30;
  double local_28;
  
  RotCo<chrono::ChVector<double>,double>(3,phi,phi,&local_38);
  dVar1 = phi->m_data[2];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar1;
  dVar2 = phi->m_data[1];
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar2;
  auVar3 = *(undefined1 (*) [16])phi->m_data;
  dVar4 = dVar1 * local_30;
  dVar30 = dVar2 * local_30;
  dVar27 = auVar3._0_8_;
  dVar5 = dVar27 * local_30;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar2 * local_38;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_38 * dVar1;
  auVar10 = vunpcklpd_avx(auVar10,auVar17);
  auVar11._0_8_ = -(dVar2 * local_38);
  auVar11._8_8_ = 0x8000000000000000;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = local_38 * dVar27;
  auVar11 = vunpcklpd_avx(auVar11,auVar28);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar4 * dVar1;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar30;
  auVar12 = vfnmsub231sd_fma(auVar25,auVar31,auVar35);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar30 * dVar2;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar5;
  auVar9 = vfnmsub231sd_fma(auVar32,auVar3,auVar34);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar2 * dVar5;
  auVar12 = vunpcklpd_avx(auVar12,auVar39);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar4;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar5 * dVar27;
  auVar6 = vfnmsub231sd_fma(auVar40,auVar8,auVar19);
  auVar17 = ZEXT816(0x3ff0000000000000);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar5 * dVar1;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar30 * dVar27;
  auVar8 = vunpcklpd_avx(auVar20,auVar37);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar30 * dVar1;
  auVar6 = vunpcklpd_avx(auVar6,auVar7);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = 0.0 - local_38 * dVar1;
  auVar7 = vunpcklpd_avx(auVar17,auVar18);
  (Phi->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       auVar7._0_8_ + auVar12._0_8_;
  (Phi->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       auVar7._8_8_ + auVar12._8_8_;
  (Phi->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       auVar10._0_8_ + 0.0 + auVar8._0_8_;
  (Phi->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       auVar10._8_8_ + 0.0 + auVar8._8_8_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = 0.0 - local_38 * dVar27;
  auVar10 = vunpcklpd_avx(auVar17,auVar21);
  (Phi->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       auVar10._0_8_ + auVar6._0_8_;
  (Phi->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       auVar10._8_8_ + auVar6._8_8_;
  (Phi->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       dVar4 * dVar27 + auVar11._0_8_ + 0.0;
  (Phi->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       dVar4 * auVar3._8_8_ + auVar11._8_8_ + 0.0;
  (Phi->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       auVar9._0_8_ + 1.0;
  dVar1 = phi->m_data[2];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar1;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_28;
  auVar3 = *(undefined1 (*) [16])phi->m_data;
  dVar2 = phi->m_data[1];
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar2;
  dVar4 = dVar1 * local_28;
  auVar6 = vmulsd_avx512f(auVar3,auVar22);
  local_28 = dVar2 * local_28;
  dVar30 = auVar3._0_8_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_30 * dVar1;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar2 * local_30;
  auVar10 = vunpcklpd_avx(auVar15,auVar12);
  auVar7 = vmulsd_avx512f(auVar36,auVar6);
  auVar16._0_8_ = -(dVar2 * local_30);
  auVar16._8_8_ = 0x8000000000000000;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar30 * local_30;
  auVar11 = vunpcklpd_avx(auVar16,auVar33);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = local_28;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar4 * dVar1;
  auVar8 = vfnmsub231sd_fma(auVar29,auVar36,auVar23);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = 0.0 - local_30 * dVar1;
  auVar12 = vunpcklpd_avx(auVar17,auVar13);
  auVar8 = vunpcklpd_avx512vl(auVar8,auVar7);
  auVar7 = vmulsd_avx512f(auVar6,auVar3);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar4;
  auVar7 = vfnmsub231sd_avx512f(auVar7,auVar9,auVar26);
  auVar9 = vmulsd_avx512f(auVar9,auVar6);
  (Ga->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       auVar12._0_8_ + auVar8._0_8_;
  (Ga->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       auVar12._8_8_ + auVar8._8_8_;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar30 * local_28;
  auVar12 = vunpcklpd_avx(auVar9,auVar38);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar2 * local_28;
  auVar8 = vfnmsub231sd_avx512f(auVar24,auVar3,auVar6);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar1 * local_28;
  auVar6 = vunpcklpd_avx512vl(auVar7,auVar6);
  (Ga->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       auVar10._0_8_ + 0.0 + auVar12._0_8_;
  (Ga->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       auVar10._8_8_ + 0.0 + auVar12._8_8_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = 0.0 - dVar30 * local_30;
  auVar10 = vunpcklpd_avx(auVar17,auVar14);
  (Ga->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       auVar10._0_8_ + auVar6._0_8_;
  (Ga->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       auVar10._8_8_ + auVar6._8_8_;
  (Ga->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       dVar30 * dVar4 + auVar11._0_8_ + 0.0;
  (Ga->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       auVar3._8_8_ * dVar4 + auVar11._8_8_ + 0.0;
  (Ga->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       auVar8._0_8_ + 1.0;
  return;
}

Assistant:

void RotAndDRot(const ChVector<>& phi, ChMatrix33<>& Phi, ChMatrix33<>& Ga) {
    double coeff[COEFF_C];

    CoeffC(phi, phi, coeff);

    ChMatrix33<> Eye(1);
    
    {
        ChStarMatrix33<> Phix(phi * coeff[0]);
        ChStarMatrix33<> pxpx(phi, phi * coeff[1]);
        Phi = Eye + Phix + pxpx;  // I + c[0] * phi x + c[1] * phi x phi x
    }

    {
        ChStarMatrix33<> Phix(phi * coeff[1]);
        ChStarMatrix33<> pxpx(phi, phi * coeff[2]);
        Ga = Eye + Phix + pxpx; // I + c[1] * phi x + c[2] * phi x phi x
    }

    return;
}